

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * __thiscall
r_code::Utils::GetString_abi_cxx11_(string *__return_storage_ptr__,Utils *this,Atom *iptr)

{
  Utils UVar1;
  char buffer [255];
  undefined1 auStack_128 [256];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  UVar1 = *this;
  memcpy(auStack_128,this + 4,(ulong)(byte)UVar1);
  auStack_128[(byte)UVar1] = 0;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::GetString(const Atom *iptr)
{
    std::string s;
    char buffer[255];
    uint8_t char_count = (iptr[0].atom & 0x000000FF);
    memcpy(buffer, iptr + 1, char_count);
    buffer[char_count] = 0;
    s += buffer;
    return s;
}